

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_compiler.cpp
# Opt level: O3

void dic_insert_word(char *word,uint value)

{
  bool bVar1;
  size_t sVar2;
  MAFSA_letter out [1024];
  MAFSA_letter aMStack_408 [1024];
  
  sVar2 = SIMPLE_conv_string_to_letters(word,aMStack_408,0x400);
  aMStack_408[sVar2] = '\x1d';
  sVar2 = sVar2 + 1;
  if (value != 0) {
    do {
      aMStack_408[sVar2] =
           (char)value - ((char)(value / 0x1d) * '\x1b' + (char)(value / 0x1d) * '\x02');
      sVar2 = sVar2 + 1;
      bVar1 = 0x1c < value;
      value = value / 0x1d;
    } while (bVar1);
  }
  MAFSA::daciuk<29>::insert(&dict,aMStack_408,sVar2);
  return;
}

Assistant:

void dic_insert_word(const char *word, unsigned int value)
{
	MAFSA_letter out [MAX_OUT];
	size_t out_sz;

	out_sz = SIMPLE_conv_string_to_letters(word, out, MAX_OUT);
	out[out_sz++] = SIMPLE_LETTER_DELIM;

	while (value)
	{
		out[out_sz++] = value % SIMPLE_LETTER_DELIM;
		value /= SIMPLE_LETTER_DELIM;
	}

	dict.insert(out, out_sz);
}